

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

void Z80::OpCode_LDD(void)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  Z80Reg ZVar4;
  Z80Reg ZVar5;
  EBracketType EVar6;
  int iVar7;
  undefined1 signedCheck;
  undefined8 in_RSI;
  char **ppcVar8;
  Z80Reg local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  Z80Reg local_48;
  Z80Reg ZStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  ppcVar8 = (char **)0x0;
  bVar1 = Options::noFakes(false);
  if (bVar1) {
    EmitByte(0xed,true);
    EmitByte(0xa8,false);
    return;
  }
  do {
    signedCheck = (undefined1)in_RSI;
    local_48 = Z80_UNK;
    ZStack_44 = Z80_UNK;
    uStack_40 = 0xffffffff;
    uStack_3c = 0xffffffff;
    local_58 = Z80_UNK;
    uStack_54 = 0xffffffff;
    uStack_50 = 0xffffffff;
    uStack_4c = 0xffffffff;
    ZVar4 = GetRegister(ppcVar8);
    if (ZVar4 < Z80_MEM_HL) {
      if ((uint)ZVar4 < 6) {
        ppcVar8 = &lp;
        bVar1 = comma(&lp);
        if (bVar1) {
          ZVar5 = GetRegister(ppcVar8);
          if ((ZVar5 == Z80_MEM_IY) || (ZVar5 == Z80_MEM_IX)) {
            Options::noFakes(true);
            uStack_54 = ZVar4 * 8 + 0x46;
            ZVar4 = ZVar5;
LAB_00138fd5:
            local_48 = ZVar4 & 0xff;
            uStack_4c = 0xfffffffe;
            ZStack_44 = Z80_DE|Z80_F|Z80_C;
            local_58 = local_48;
            uStack_50 = GetRegister_lastIxyD;
          }
          else if (ZVar5 == Z80_MEM_HL) {
            Options::noFakes(true);
            local_58 = ZVar4 * 8 + (Z80_SP|Z80_MEM_HL);
LAB_0013901a:
            uStack_54 = 0xfffffffe;
            uStack_50 = 0x2b;
          }
        }
      }
      else {
LAB_00139024:
        ppcVar8 = &lp;
        EVar6 = OpenBracket(&lp);
        if (EVar6 == BT_NONE) {
          local_58 = 0xed;
          uStack_54 = 0xa8;
        }
        else {
          ZVar4 = GetRegister(ppcVar8);
          iVar7 = CloseBracket(&lp);
          if (iVar7 != 0) {
            ppcVar8 = &lp;
            bVar1 = comma(&lp);
            if ((bVar1) &&
               (((ZVar4 == Z80_DE || (ZVar4 == Z80_BC)) &&
                (ZVar5 = GetRegister(ppcVar8), ZVar5 == Z80_A)))) {
              Options::noFakes(true);
              local_58 = ZVar4 + ~(Z80_I|Z80_L);
LAB_001390e6:
              uStack_54 = 0xfffffffe;
              uStack_50 = ZVar4 + ~Z80_H;
            }
          }
        }
      }
    }
    else if (ZVar4 < Z80_MEM_IX) {
      if (ZVar4 == Z80_MEM_HL) {
        ppcVar8 = &lp;
        bVar1 = comma(&lp);
        if (bVar1) {
          ZVar4 = GetRegister(ppcVar8);
          if ((uint)ZVar4 < 6) {
LAB_0013900a:
            Options::noFakes(true);
            local_58 = ZVar4 + (Z80_SP|Z80_HL);
            goto LAB_0013901a;
          }
          if (ZVar4 == Z80_UNK) {
            Options::noFakes(true);
            local_58 = Z80_HL|Z80_MEM_HL;
            bVar2 = GetByteNoMem((char **)0x0,(bool)signedCheck);
            uStack_54 = (uint)bVar2;
            uStack_50 = 0xfffffffe;
            uStack_4c = 0x2b;
          }
          else if (ZVar4 == Z80_A) goto LAB_0013900a;
        }
      }
      else {
        if (ZVar4 != Z80_A) goto LAB_00139024;
        bVar1 = comma(&lp);
        if ((bVar1) && (EVar6 = OpenBracket(&lp), EVar6 != BT_NONE)) {
          ppcVar8 = (char **)0x1;
          Options::noFakes(true);
          ZVar4 = GetRegister(ppcVar8);
          if (ZVar4 < Z80_HL) {
            if ((ZVar4 == Z80_BC) || (ZVar4 == Z80_DE)) {
              iVar7 = CloseBracket(&lp);
              if (iVar7 != 0) {
                local_58 = ZVar4 + ~Z80_L;
              }
              goto LAB_001390e6;
            }
          }
          else {
            if (ZVar4 == Z80_HL) {
              iVar7 = CloseBracket(&lp);
              if (iVar7 != 0) {
                local_58 = Z80_SP|Z80_HL|Z80_I|Z80_MEM_HL;
              }
              goto LAB_0013901a;
            }
            if ((ZVar4 == Z80_IX) || (ZVar4 == Z80_IY)) {
              uStack_54 = 0x7e;
              bVar2 = z80GetIDxoffset(ppcVar8);
              uStack_50 = (uint)bVar2;
              uStack_4c = 0xfffffffe;
              ZStack_44 = Z80_DE|Z80_F|Z80_C;
              iVar7 = CloseBracket(&lp);
              if (iVar7 != 0) {
                local_58 = ZVar4;
                local_48 = ZVar4;
              }
            }
          }
        }
      }
    }
    else {
      if ((ZVar4 != Z80_MEM_IX) && (ZVar4 != Z80_MEM_IY)) goto LAB_00139024;
      ppcVar8 = &lp;
      bVar1 = comma(&lp);
      if (bVar1) {
        ZVar5 = GetRegister(ppcVar8);
        if ((uint)ZVar5 < 6) {
LAB_00138f82:
          Options::noFakes(true);
          uStack_54 = ZVar5 + (Z80_SP|Z80_HL);
          goto LAB_00138fd5;
        }
        if (ZVar5 == Z80_UNK) {
          Options::noFakes(true);
          local_58 = ZVar4 & 0xff;
          uStack_54 = 0x36;
          uStack_50 = GetRegister_lastIxyD;
          ZStack_44 = local_58;
          bVar2 = GetByteNoMem((char **)0x0,(bool)signedCheck);
          uStack_4c = (uint)bVar2;
          local_48 = ~Z80_C;
          uStack_40 = 0x2b;
        }
        else if (ZVar5 == Z80_A) goto LAB_00138f82;
      }
    }
    in_RSI = 1;
    EmitBytes(&local_58,true);
    ppcVar8 = &lp;
    cVar3 = (*DAT_0018d520)();
    if (cVar3 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_LDD() {
		if (Options::noFakes(false)) {
			EmitByte(0xED, true);
			EmitByte(0xA8);
			return;
		}

		// only when fakes are enabled (but they may be silent/warning enabled, so extra checks needed)
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1 };
			Z80Reg reg2 = Z80_UNK, reg = GetRegister(lp);
			switch (reg) {
			case Z80_A:
				if (!comma(lp)) break;
				if (BT_NONE == OpenBracket(lp)) break;
				Options::noFakes();		// to display warning if "-f"
				switch (reg = GetRegister(lp)) {
				case Z80_BC:	// 0x0A 0x0B
				case Z80_DE:	// 0x1A 0x1B
					if (CloseBracket(lp)) e[0] = reg-6;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = reg-5;
					break;
				case Z80_HL:	// 0x7E	0x2B
					if (CloseBracket(lp)) e[0] = 0x7e;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x2b;
					break;
				case Z80_IX: case Z80_IY:
					e[1] = 0x7e; e[2] = z80GetIDxoffset(lp);
					e[3] = INSTRUCTION_START_MARKER;
					e[5] = 0x2b;
					if (CloseBracket(lp)) e[0] = e[4] = reg;
					break;
				default:
					break;
				}
				break;
			case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_MEM_HL:
					Options::noFakes();		// to display warning if "-f"
					e[0] = 0x46 + reg * 8;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x2b;
					break;
				case Z80_MEM_IX: case Z80_MEM_IY:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[4] = reg2&0xFF;
					e[1] = 0x46 + reg * 8;
					e[2] = GetRegister_lastIxyD;
					e[3] = INSTRUCTION_START_MARKER;
					e[5] = 0x2b;
					break;
				default:
					break;
				}
				break;
			case Z80_MEM_HL:
				if (!comma(lp)) break;
				switch (reg = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[0] = 0x70 + reg;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x2b;
					break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[0] = 0x36; e[1] = GetByteNoMem(lp);
					e[2] = INSTRUCTION_START_MARKER;
					e[3] = 0x2b;
					break;
				default:
					break;
				}
				break;
			case Z80_MEM_IX: case Z80_MEM_IY:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[4] = reg&0xFF;
					e[2] = GetRegister_lastIxyD;
					e[1] = 0x70 + reg2;
					e[3] = INSTRUCTION_START_MARKER;
					e[5] = 0x2b;
					break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[5] = reg&0xFF;
					e[1] = 0x36;
					e[2] = GetRegister_lastIxyD;
					e[3] = GetByteNoMem(lp);
					e[4] = INSTRUCTION_START_MARKER;
					e[6] = 0x2b;
					break;
				default:
					break;
				}
				break;
			default:
				if (BT_NONE != OpenBracket(lp)) {
					reg = GetRegister(lp);
					if (!CloseBracket(lp) || !comma(lp)) break;
					if ((Z80_BC != reg && Z80_DE != reg) || Z80_A != GetRegister(lp)) break;
					Options::noFakes();		// to display warning if "-f"
					e[0] = reg - 14;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = reg - 5;	// LDD (bc|de),a
				} else {
					e[0] = 0xed; e[1] = 0xa8;			// regular LDD
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}